

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_acc_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,size_t nb1,size_t nb2,size_t nb3,
             size_t offset,_Bool inplace)

{
  _Bool _Var1;
  long lVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  char *pcVar5;
  int line;
  char *file;
  
  lVar2 = b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3];
  lVar4 = a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3];
  if (lVar2 - lVar4 == 0 || lVar2 < lVar4) {
    _Var1 = ggml_is_contiguous_n(a,0);
    if (_Var1) {
      if (a->type == GGML_TYPE_F32) {
        if (b->type == GGML_TYPE_F32) {
          if (inplace) {
            pgVar3 = ggml_view_tensor(ctx,a);
          }
          else {
            pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(ggml_tensor *)0x0,0);
          }
          if (pgVar3 != (ggml_tensor *)0x0) {
            pgVar3->op_params[0] = (int32_t)nb1;
            pgVar3->op_params[1] = (int32_t)nb2;
            pgVar3->op_params[2] = (int32_t)nb3;
            pgVar3->op_params[3] = (int32_t)offset;
            pgVar3->op_params[4] = (uint)inplace;
            pgVar3->op = GGML_OP_ACC;
            pgVar3->src[0] = a;
            pgVar3->src[1] = b;
            return pgVar3;
          }
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-impl.h"
          ;
          pcVar5 = "tensor != NULL";
          line = 0x70;
        }
        else {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
          pcVar5 = "b->type == GGML_TYPE_F32";
          line = 0x7ac;
        }
      }
      else {
        file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
        ;
        pcVar5 = "a->type == GGML_TYPE_F32";
        line = 0x7ab;
      }
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
      pcVar5 = "ggml_is_contiguous(a)";
      line = 0x7aa;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c";
    pcVar5 = "ggml_nelements(b) <= ggml_nelements(a)";
    line = 0x7a9;
  }
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

static struct ggml_tensor * ggml_acc_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset,
        bool                  inplace) {
    GGML_ASSERT(ggml_nelements(b) <= ggml_nelements(a));
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(a->type == GGML_TYPE_F32);
    GGML_ASSERT(b->type == GGML_TYPE_F32);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[] = { nb1, nb2, nb3, offset, inplace ? 1 : 0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_ACC;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}